

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void xmlValidityError(xmlParserCtxtPtr ctxt,xmlParserErrors error,char *msg,xmlChar *str1,
                     xmlChar *str2)

{
  _xmlSAXHandler *p_Var1;
  xmlStructuredErrorFunc schannel;
  
  if (ctxt != (xmlParserCtxtPtr)0x0) {
    if ((ctxt->disableSAX != 0) && (ctxt->instate == XML_PARSER_EOF)) {
      return;
    }
    ctxt->errNo = error;
    p_Var1 = ctxt->sax;
    if ((p_Var1 != (_xmlSAXHandler *)0x0) && (p_Var1->initialized == 0xdeedbeaf)) {
      schannel = p_Var1->serror;
      goto LAB_0015d5f3;
    }
  }
  schannel = (xmlStructuredErrorFunc)0x0;
LAB_0015d5f3:
  if (ctxt == (xmlParserCtxtPtr)0x0) {
    __xmlRaiseError(schannel,(xmlGenericErrorFunc)0x0,(void *)0x0,(void *)0x0,(void *)0x0,4,error,
                    XML_ERR_ERROR,(char *)0x0,0,(char *)str1,(char *)str2,(char *)0x0,0,0,msg,str1,
                    str2);
  }
  else {
    __xmlRaiseError(schannel,(ctxt->vctxt).error,(ctxt->vctxt).userData,ctxt,(void *)0x0,4,error,
                    XML_ERR_ERROR,(char *)0x0,0,(char *)str1,(char *)str2,(char *)0x0,0,0,msg,str1,
                    str2);
    ctxt->valid = 0;
  }
  return;
}

Assistant:

static void LIBXML_ATTR_FORMAT(3,0)
xmlValidityError(xmlParserCtxtPtr ctxt, xmlParserErrors error,
              const char *msg, const xmlChar *str1, const xmlChar *str2)
{
    xmlStructuredErrorFunc schannel = NULL;

    if ((ctxt != NULL) && (ctxt->disableSAX != 0) &&
        (ctxt->instate == XML_PARSER_EOF))
	return;
    if (ctxt != NULL) {
	ctxt->errNo = error;
	if ((ctxt->sax != NULL) && (ctxt->sax->initialized == XML_SAX2_MAGIC))
	    schannel = ctxt->sax->serror;
    }